

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> __thiscall
wallet::LegacyScriptPubKeyMan::GetMetadata(LegacyScriptPubKeyMan *this,CTxDestination *dest)

{
  long lVar1;
  bool bVar2;
  const_iterator this_00;
  CTxDestination *in_RDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  CKeyMetadata *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  const_iterator it_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CScript scriptPubKey;
  CKeyID key_id;
  CTxDestination *in_stack_ffffffffffffff08;
  map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
  *in_stack_ffffffffffffff10;
  base_blob<160U> *in_stack_ffffffffffffff18;
  AnnotatedMixin<std::recursive_mutex> *pAVar3;
  const_iterator in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2b;
  int in_stack_ffffffffffffff2c;
  _Head_base<0UL,_wallet::CKeyMetadata_*,_false> pszName;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
            ((long)&in_RSI[2].super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8);
  pszName._M_head_impl = in_RDI;
  pAVar3 = in_RSI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff08);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_01,in_RSI,(char *)pszName._M_head_impl,(char *)in_RDI,in_stack_ffffffffffffff2c,
             (bool)in_stack_ffffffffffffff2b);
  GetKeyForDestination((SigningProvider *)pAVar3,in_RDX);
  bVar2 = base_blob<160U>::IsNull(in_stack_ffffffffffffff18);
  if (!bVar2) {
    in_stack_ffffffffffffff20 =
         std::
         map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
         ::find((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 *)in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
    std::
    map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
    ::end((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           *)in_stack_ffffffffffffff10);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,(_Self *)in_stack_ffffffffffffff10);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
                 in_stack_ffffffffffffff08);
      std::make_unique<wallet::CKeyMetadata,wallet::CKeyMetadata_const&>(in_RDI);
      goto LAB_00a1856a;
    }
  }
  GetScriptForDestination(in_stack_ffffffffffffff08);
  pAVar3 = in_RSI + 0xe;
  CScriptID::CScriptID((CScriptID *)in_stack_ffffffffffffff20._M_node,(CScript *)pAVar3);
  this_00 = std::
            map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
            ::find(in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
  std::
  map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
  ::end((map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
         *)this_00._M_node);
  bVar2 = std::operator==((_Self *)pAVar3,(_Self *)this_00._M_node);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::unique_ptr<wallet::CKeyMetadata,std::default_delete<wallet::CKeyMetadata>>::
    unique_ptr<std::default_delete<wallet::CKeyMetadata>,void>
              ((unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> *)
               in_stack_ffffffffffffff08,(nullptr_t)0xa18555);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_> *)
               in_stack_ffffffffffffff08);
    std::make_unique<wallet::CKeyMetadata,wallet::CKeyMetadata_const&>(in_RDI);
  }
  CScript::~CScript((CScript *)in_stack_ffffffffffffff08);
LAB_00a1856a:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
          )(tuple<wallet::CKeyMetadata_*,_std::default_delete<wallet::CKeyMetadata>_>)
           pszName._M_head_impl;
}

Assistant:

std::unique_ptr<CKeyMetadata> LegacyScriptPubKeyMan::GetMetadata(const CTxDestination& dest) const
{
    LOCK(cs_KeyStore);

    CKeyID key_id = GetKeyForDestination(*this, dest);
    if (!key_id.IsNull()) {
        auto it = mapKeyMetadata.find(key_id);
        if (it != mapKeyMetadata.end()) {
            return std::make_unique<CKeyMetadata>(it->second);
        }
    }

    CScript scriptPubKey = GetScriptForDestination(dest);
    auto it = m_script_metadata.find(CScriptID(scriptPubKey));
    if (it != m_script_metadata.end()) {
        return std::make_unique<CKeyMetadata>(it->second);
    }

    return nullptr;
}